

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

ATTACH_HANDLE attach_create(char *name_value,handle handle_value,role role_value)

{
  int iVar1;
  ATTACH_INSTANCE_TAG AVar2;
  AMQP_VALUE item_value;
  AMQP_VALUE item_value_00;
  AMQP_VALUE item_value_01;
  int local_3c;
  int result;
  AMQP_VALUE role_amqp_value;
  AMQP_VALUE handle_amqp_value;
  AMQP_VALUE name_amqp_value;
  ATTACH_INSTANCE *attach_instance;
  role role_value_local;
  handle handle_value_local;
  char *name_value_local;
  
  name_amqp_value = (AMQP_VALUE)malloc(8);
  if (name_amqp_value != (AMQP_VALUE)0x0) {
    AVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x12);
    *(AMQP_VALUE *)name_amqp_value = AVar2.composite_value;
    if (*(AMQP_VALUE *)name_amqp_value == (AMQP_VALUE)0x0) {
      free(name_amqp_value);
      name_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_3c = 0;
      item_value = amqpvalue_create_string(name_value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)name_amqp_value,0,item_value);
      if (iVar1 != 0) {
        local_3c = 0xd8f;
      }
      item_value_00 = amqpvalue_create_handle(handle_value);
      if ((local_3c == 0) &&
         (iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)name_amqp_value,1,item_value_00),
         iVar1 != 0)) {
        local_3c = 0xd94;
      }
      item_value_01 = amqpvalue_create_role(role_value);
      if ((local_3c == 0) &&
         (iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)name_amqp_value,2,item_value_01),
         iVar1 != 0)) {
        local_3c = 0xd99;
      }
      amqpvalue_destroy(item_value);
      amqpvalue_destroy(item_value_00);
      amqpvalue_destroy(item_value_01);
      if (local_3c != 0) {
        attach_destroy((ATTACH_HANDLE)name_amqp_value);
        name_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (ATTACH_HANDLE)name_amqp_value;
}

Assistant:

ATTACH_HANDLE attach_create(const char* name_value, handle handle_value, role role_value)
{
    ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)malloc(sizeof(ATTACH_INSTANCE));
    if (attach_instance != NULL)
    {
        attach_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(18);
        if (attach_instance->composite_value == NULL)
        {
            free(attach_instance);
            attach_instance = NULL;
        }
        else
        {
            AMQP_VALUE name_amqp_value;
            AMQP_VALUE handle_amqp_value;
            AMQP_VALUE role_amqp_value;
            int result = 0;

            name_amqp_value = amqpvalue_create_string(name_value);
            if ((result == 0) && (amqpvalue_set_composite_item(attach_instance->composite_value, 0, name_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            handle_amqp_value = amqpvalue_create_handle(handle_value);
            if ((result == 0) && (amqpvalue_set_composite_item(attach_instance->composite_value, 1, handle_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            role_amqp_value = amqpvalue_create_role(role_value);
            if ((result == 0) && (amqpvalue_set_composite_item(attach_instance->composite_value, 2, role_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(name_amqp_value);
            amqpvalue_destroy(handle_amqp_value);
            amqpvalue_destroy(role_amqp_value);
            if (result != 0)
            {
                attach_destroy(attach_instance);
                attach_instance = NULL;
            }
        }
    }

    return attach_instance;
}